

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O0

void __thiscall sf2cute::SFInstrument::SetBackwardReferences(SFInstrument *this)

{
  bool bVar1;
  reference this_00;
  pointer pSVar2;
  unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *zone;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *__range1;
  SFInstrument *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ::begin(&this->zones_);
  zone = (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *)
         std::
         vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
         ::end(&this->zones_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
                                     *)&zone), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
              ::operator*(&__end1);
    pSVar2 = std::
             unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
             ::operator->(this_00);
    SFInstrumentZone::set_parent_instrument(pSVar2,this);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_*,_std::vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = has_global_zone(this);
  if (bVar1) {
    pSVar2 = std::
             unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
             ::operator->(&this->global_zone_);
    SFInstrumentZone::set_parent_instrument(pSVar2,this);
  }
  return;
}

Assistant:

void SFInstrument::SetBackwardReferences() noexcept {
  // Update the instrument zones.
  for (const auto & zone : zones_) {
    zone->set_parent_instrument(*this);
  }

  // Update the global instrument zone.
  if (has_global_zone()) {
    global_zone_->set_parent_instrument(*this);
  }
}